

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O2

Hop_Obj_t * Hop_Complement(Hop_Man_t *p,Hop_Obj_t *pRoot,int iVar)

{
  Hop_Obj_t *pHVar1;
  Hop_Obj_t *pObj;
  
  if (iVar < p->nObjs[2]) {
    pObj = (Hop_Obj_t *)((ulong)pRoot & 0xfffffffffffffffe);
    pHVar1 = Hop_ManPi(p,iVar);
    Hop_Complement_rec(p,pObj,pHVar1);
    Hop_ConeUnmark_rec(pObj);
    pHVar1 = (Hop_Obj_t *)((ulong)((uint)pRoot & 1) ^ (ulong)(pObj->field_0).pData);
  }
  else {
    pHVar1 = (Hop_Obj_t *)0x0;
    printf("Hop_Complement(): The PI variable %d is not defined.\n",(ulong)(uint)iVar);
  }
  return pHVar1;
}

Assistant:

Hop_Obj_t * Hop_Complement( Hop_Man_t * p, Hop_Obj_t * pRoot, int iVar )
{
    // quit if the PI variable is not defined
    if ( iVar >= Hop_ManPiNum(p) )
    {
        printf( "Hop_Complement(): The PI variable %d is not defined.\n", iVar );
        return NULL;
    }
    // recursively perform composition
    Hop_Complement_rec( p, Hop_Regular(pRoot), Hop_ManPi(p, iVar) );
    // clear the markings
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    return Hop_NotCond( (Hop_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );
}